

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::verifyOutputImage
          (FunctionalTest *this,testCase *test_case,size_t output_format_index,
          GLint output_channel_size,size_t index_of_swizzled_channel,GLubyte *data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GLint GVar5;
  GLint GVar6;
  GLint GVar7;
  GLint GVar8;
  GLint GVar9;
  GLint GVar10;
  GLint GVar11;
  GLint GVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  GLubyte GVar16;
  GLubyte GVar17;
  undefined8 *puVar18;
  TestError *this_00;
  long lVar19;
  bool bVar20;
  size_t texel_size;
  GLubyte expected_data_top [8];
  GLubyte expected_data_low [8];
  
  expected_data_low[0] = '\0';
  expected_data_low[1] = '\0';
  expected_data_low[2] = '\0';
  expected_data_low[3] = '\0';
  expected_data_low[4] = '\0';
  expected_data_low[5] = '\0';
  expected_data_low[6] = '\0';
  expected_data_low[7] = '\0';
  expected_data_top[0] = '\0';
  expected_data_top[1] = '\0';
  expected_data_top[2] = '\0';
  expected_data_top[3] = '\0';
  expected_data_top[4] = '\0';
  expected_data_top[5] = '\0';
  expected_data_top[6] = '\0';
  expected_data_top[7] = '\0';
  texel_size = 0;
  calculate_expected_value
            (test_case->m_source_texture_format_index,output_format_index,index_of_swizzled_channel,
             test_case->m_texture_sizes[index_of_swizzled_channel],output_channel_size,
             expected_data_low,expected_data_top,&texel_size);
  GVar16 = expected_data_top[0];
  GVar17 = expected_data_low[0];
  uVar1 = expected_data_top._0_4_;
  uVar2 = expected_data_low._0_4_;
  lVar19 = 0x40;
  do {
    bVar20 = lVar19 == 0;
    lVar19 = lVar19 + -1;
    if (bVar20) {
      return;
    }
    switch(*(undefined4 *)(&DAT_01e7a2cc + output_format_index * 0x78)) {
    case 0x1400:
    case 0x140b:
      if (((char)GVar16 < (char)*data) || ((char)*data < (char)GVar17)) {
LAB_00929e60:
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x48);
        *puVar18 = &PTR__exception_01db2350;
        uVar1 = *(undefined4 *)((long)&test_case->m_channel_index + 4);
        sVar13 = test_case->m_source_texture_format_index;
        uVar2 = *(undefined4 *)((long)&test_case->m_source_texture_format_index + 4);
        sVar14 = test_case->m_source_texture_target_index;
        uVar3 = *(undefined4 *)((long)&test_case->m_source_texture_target_index + 4);
        sVar15 = test_case->m_texture_access_index;
        uVar4 = *(undefined4 *)((long)&test_case->m_texture_access_index + 4);
        GVar5 = test_case->m_texture_swizzle_red;
        GVar6 = test_case->m_texture_swizzle_green;
        GVar7 = test_case->m_texture_swizzle_blue;
        GVar8 = test_case->m_texture_swizzle_alpha;
        GVar9 = test_case->m_texture_sizes[0];
        GVar10 = test_case->m_texture_sizes[1];
        GVar11 = test_case->m_texture_sizes[2];
        GVar12 = test_case->m_texture_sizes[3];
        *(int *)(puVar18 + 1) = (int)test_case->m_channel_index;
        *(undefined4 *)((long)puVar18 + 0xc) = uVar1;
        *(int *)(puVar18 + 2) = (int)sVar13;
        *(undefined4 *)((long)puVar18 + 0x14) = uVar2;
        *(int *)(puVar18 + 3) = (int)sVar14;
        *(undefined4 *)((long)puVar18 + 0x1c) = uVar3;
        *(int *)(puVar18 + 4) = (int)sVar15;
        *(undefined4 *)((long)puVar18 + 0x24) = uVar4;
        *(GLint *)(puVar18 + 5) = GVar5;
        *(GLint *)((long)puVar18 + 0x2c) = GVar6;
        *(GLint *)(puVar18 + 6) = GVar7;
        *(GLint *)((long)puVar18 + 0x34) = GVar8;
        *(GLint *)(puVar18 + 7) = GVar9;
        *(GLint *)((long)puVar18 + 0x3c) = GVar10;
        *(GLint *)(puVar18 + 8) = GVar11;
        *(GLint *)((long)puVar18 + 0x44) = GVar12;
        __cxa_throw(puVar18,&wrongResults::typeinfo,std::exception::~exception);
      }
      break;
    case 0x1401:
      if ((GVar16 < *data) || (*data < GVar17)) goto LAB_00929e60;
      break;
    case 0x1402:
      if (((short)expected_data_top._0_2_ < *(short *)data) ||
         (*(short *)data < (short)expected_data_low._0_2_)) goto LAB_00929e60;
      break;
    case 0x1403:
    case 0x1405:
      if (((ushort)expected_data_top._0_2_ < *(ushort *)data) ||
         (*(ushort *)data < (ushort)expected_data_low._0_2_)) goto LAB_00929e60;
      break;
    case 0x1404:
      if (((int)uVar1 < (int)*(float *)data) || ((int)*(float *)data < (int)uVar2))
      goto LAB_00929e60;
      break;
    case 0x1406:
      if (((float)uVar1 < *(float *)data) || (*(float *)data < (float)uVar2)) goto LAB_00929e60;
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0x107f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    data = (GLubyte *)((long)data + texel_size);
  } while( true );
}

Assistant:

void FunctionalTest::verifyOutputImage(const testCase& test_case, size_t output_format_index,
									   glw::GLint output_channel_size, size_t index_of_swizzled_channel,
									   const glw::GLubyte* data)
{
	const _texture_format& output_format = texture_formats[output_format_index];

	glw::GLubyte expected_data_low[8] = { 0 };
	glw::GLubyte expected_data_top[8] = { 0 };
	size_t		 texel_size			  = 0;

	calculate_expected_value(test_case.m_source_texture_format_index, output_format_index, index_of_swizzled_channel,
							 test_case.m_texture_sizes[index_of_swizzled_channel], output_channel_size,
							 expected_data_low, expected_data_top, texel_size);

	for (size_t i = 0; i < m_output_height * m_output_width; ++i)
	{
		const size_t	   offset  = i * texel_size;
		const glw::GLvoid* pointer = data + offset;

		bool res = false;

		switch (output_format.m_type)
		{
		case GL_BYTE:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_BYTE:
			res = isInRange<glw::GLubyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_SHORT:
			res = isInRange<glw::GLshort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_SHORT:
			res = isInRange<glw::GLushort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_HALF_FLOAT:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_INT:
			res = isInRange<glw::GLint>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_INT:
			res = isInRange<glw::GLhalf>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_FLOAT:
			res = isInRange<glw::GLfloat>(pointer, expected_data_low, expected_data_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		if (false == res)
		{
			throw wrongResults(test_case);
		}
	}
}